

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::WithFunctionSampleSyntax::getChild(WithFunctionSampleSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  undefined8 in_RDX;
  ConstTokenOrSyntax *in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff98;
  
  switch(in_RDX) {
  case 0:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffff98;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x7dc256,token);
    break;
  case 1:
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffff98;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x7dc283,token_00);
    break;
  case 2:
    token_01.info = in_RDI;
    token_01._0_8_ = in_stack_ffffffffffffff98;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x7dc2b0,token_01);
    break;
  case 3:
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffff98);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RSI,in_RDI);
  }
  return (ConstTokenOrSyntax *)in_RDI;
}

Assistant:

ConstTokenOrSyntax WithFunctionSampleSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return with;
        case 1: return function;
        case 2: return sample;
        case 3: return portList;
        default: return nullptr;
    }
}